

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O2

word * Gia_ObjComputeTruthTableCut(Gia_Man_t *p,Gia_Obj_t *pRoot,Vec_Int_t *vLeaves)

{
  word *pwVar1;
  word *pwVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Gia_Obj_t *pGVar8;
  word *pwVar9;
  word *pwVar10;
  word *pwVar11;
  word Fill;
  long lVar12;
  
  if (p->vTtMemory == (Vec_Wrd_t *)0x0) {
    __assert_fail("p->vTtMemory != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaTruth.c"
                  ,0x168,"word *Gia_ObjComputeTruthTableCut(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)")
    ;
  }
  if (vLeaves->nSize <= p->nTtVars) {
    if (p->vTtNums->nSize < p->nObjs) {
      Vec_IntFillExtra(p->vTtNums,p->nObjs,-1000000000);
    }
    iVar4 = Gia_ObjId(p,pRoot);
    Gia_ObjCollectInternalCut(p,iVar4,vLeaves);
    iVar4 = (p->vTtNodes->nSize + 2) * p->nTtWords;
    if (p->vTtMemory->nSize < iVar4) {
      Vec_WrdFillExtra(p->vTtMemory,iVar4,Fill);
    }
    iVar4 = 1;
    while( true ) {
      if (p->vTtNodes->nSize <= iVar4) {
        pwVar11 = Gla_ObjTruthNode(p,pRoot);
        for (iVar4 = 0; iVar4 < vLeaves->nSize; iVar4 = iVar4 + 1) {
          iVar5 = Vec_IntEntry(vLeaves,iVar4);
          Gia_ObjResetNumId(p,iVar5);
        }
        iVar4 = 1;
        while( true ) {
          if (p->vTtNodes->nSize <= iVar4) break;
          iVar5 = Vec_IntEntry(p->vTtNodes,iVar4);
          Gia_ObjResetNumId(p,iVar5);
          iVar4 = iVar4 + 1;
        }
        return pwVar11;
      }
      iVar5 = Vec_IntEntry(p->vTtNodes,iVar4);
      iVar6 = Gia_ObjNumId(p,iVar5);
      if (iVar4 != iVar6) break;
      pGVar8 = Gia_ManObj(p,iVar5);
      pwVar11 = p->vTtMemory->pArray;
      iVar6 = p->nTtWords;
      iVar7 = Gia_ObjNumId(p,iVar5 - (*(uint *)pGVar8 & 0x1fffffff));
      iVar5 = Gia_ObjNumId(p,iVar5 - (*(uint *)&pGVar8->field_0x4 & 0x1fffffff));
      if (iVar7 < 1) {
        pwVar9 = Gla_ObjTruthElem(p,-iVar7);
      }
      else {
        pwVar9 = p->vTtMemory->pArray + (long)iVar7 * (long)p->nTtWords;
      }
      if (iVar5 < 1) {
        pwVar10 = Gla_ObjTruthElem(p,-iVar5);
      }
      else {
        pwVar10 = p->vTtMemory->pArray + (long)iVar5 * (long)p->nTtWords;
      }
      iVar5 = iVar6 * iVar4;
      pwVar1 = pwVar11 + (long)iVar5 + (long)iVar6;
      uVar3 = *(ulong *)pGVar8;
      if (((uint)uVar3 >> 0x1d & 1) == 0) {
        if ((uVar3 >> 0x3d & 1) == 0) {
          for (lVar12 = 0; pwVar2 = (word *)((long)pwVar11 + lVar12 + (long)iVar5 * 8),
              pwVar2 < pwVar1; lVar12 = lVar12 + 8) {
            *pwVar2 = *(ulong *)((long)pwVar10 + lVar12) & *(ulong *)((long)pwVar9 + lVar12);
          }
        }
        else {
          for (lVar12 = 0; pwVar2 = (word *)((long)pwVar11 + lVar12 + (long)iVar5 * 8),
              pwVar2 < pwVar1; lVar12 = lVar12 + 8) {
            *pwVar2 = ~*(ulong *)((long)pwVar10 + lVar12) & *(ulong *)((long)pwVar9 + lVar12);
          }
        }
      }
      else if ((uVar3 >> 0x3d & 1) == 0) {
        for (lVar12 = 0; pwVar2 = (word *)((long)pwVar11 + lVar12 + (long)iVar5 * 8),
            pwVar2 < pwVar1; lVar12 = lVar12 + 8) {
          *pwVar2 = ~*(ulong *)((long)pwVar9 + lVar12) & *(ulong *)((long)pwVar10 + lVar12);
        }
      }
      else {
        for (lVar12 = 0; pwVar2 = (word *)((long)pwVar11 + lVar12 + (long)iVar5 * 8),
            pwVar2 < pwVar1; lVar12 = lVar12 + 8) {
          *pwVar2 = ~(*(ulong *)((long)pwVar10 + lVar12) | *(ulong *)((long)pwVar9 + lVar12));
        }
      }
      iVar4 = iVar4 + 1;
    }
    __assert_fail("i == Gia_ObjNumId(p, iObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaTruth.c"
                  ,0x175,"word *Gia_ObjComputeTruthTableCut(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)")
    ;
  }
  __assert_fail("Vec_IntSize(vLeaves) <= p->nTtVars",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaTruth.c"
                ,0x169,"word *Gia_ObjComputeTruthTableCut(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
}

Assistant:

word * Gia_ObjComputeTruthTableCut( Gia_Man_t * p, Gia_Obj_t * pRoot, Vec_Int_t * vLeaves )
{
    Gia_Obj_t * pTemp;
    word * pTruth, * pTruthL, * pTruth0, * pTruth1;
    int i, iObj, Id0, Id1;
    assert( p->vTtMemory != NULL );
    assert( Vec_IntSize(vLeaves) <= p->nTtVars );
    // extend ID numbers
    if ( Vec_IntSize(p->vTtNums) < Gia_ManObjNum(p) )
        Vec_IntFillExtra( p->vTtNums, Gia_ManObjNum(p), -ABC_INFINITY );
    // collect internal nodes
    Gia_ObjCollectInternalCut( p, Gia_ObjId(p, pRoot), vLeaves );
    // extend TT storage
    if ( Vec_WrdSize(p->vTtMemory) < p->nTtWords * (Vec_IntSize(p->vTtNodes) + 2) )
        Vec_WrdFillExtra( p->vTtMemory, p->nTtWords * (Vec_IntSize(p->vTtNodes) + 2), 0 );
    // compute the truth table for internal nodes
    Vec_IntForEachEntryStart( p->vTtNodes, iObj, i, 1 )
    {
        assert( i == Gia_ObjNumId(p, iObj) );
        pTemp   = Gia_ManObj( p, iObj );
        pTruth  = Gla_ObjTruthNodeId( p, i );  
        pTruthL = pTruth + p->nTtWords;
        Id0 = Gia_ObjNumId( p, Gia_ObjFaninId0(pTemp, iObj) );
        Id1 = Gia_ObjNumId( p, Gia_ObjFaninId1(pTemp, iObj) );
        pTruth0 = (Id0 > 0) ? Gla_ObjTruthNodeId(p, Id0) : Gla_ObjTruthElem(p, -Id0);
        pTruth1 = (Id1 > 0) ? Gla_ObjTruthNodeId(p, Id1) : Gla_ObjTruthElem(p, -Id1);
        if ( Gia_ObjFaninC0(pTemp) )
        {
            if ( Gia_ObjFaninC1(pTemp) )
                while ( pTruth < pTruthL )
                    *pTruth++ = ~*pTruth0++ & ~*pTruth1++;
            else
                while ( pTruth < pTruthL )
                    *pTruth++ = ~*pTruth0++ &  *pTruth1++;
        }
        else
        {
            if ( Gia_ObjFaninC1(pTemp) )
                while ( pTruth < pTruthL )
                    *pTruth++ =  *pTruth0++ & ~*pTruth1++;
            else
                while ( pTruth < pTruthL )
                    *pTruth++ =  *pTruth0++ &  *pTruth1++;
        }
    }
    pTruth = Gla_ObjTruthNode( p, pRoot );
    // unmark leaves marked by Gia_ObjCollectInternal()
    Vec_IntForEachEntry( vLeaves, iObj, i )
        Gia_ObjResetNumId( p, iObj );
    Vec_IntForEachEntryStart( p->vTtNodes, iObj, i, 1 )
        Gia_ObjResetNumId( p, iObj );
    return pTruth;
}